

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O1

string * __thiscall
flatbuffers::Namer::Type(string *__return_storage_ptr__,Namer *this,string *t,string *s)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pcVar1 = (t->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,pcVar1,pcVar1 + t->_M_string_length);
  std::__cxx11::string::append((char *)local_68);
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_68,(ulong)(s->_M_dataplus)._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_38 = *plVar3;
    uStack_30 = (undefined4)plVar2[3];
    uStack_2c = *(undefined4 *)((long)plVar2 + 0x1c);
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar3;
    local_48 = (long *)*plVar2;
  }
  local_40 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (*this->_vptr_Namer[0x14])(__return_storage_ptr__,this,&local_48,(ulong)(this->config_).types);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Type(const std::string &t, const std::string &s) const {
    return Format(t + "_" + s, config_.types);
  }